

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O3

Voice * __thiscall Synthesizer::SynthesizerChannel::AllocateVoice(SynthesizerChannel *this,int key)

{
  Voice **ppVVar1;
  Voice *pVVar2;
  Voice *pVVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  int iVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  
  if (this->keys[key] != (Voice *)0x0) {
    return this->keys[key];
  }
  lVar4 = (long)this->numvoices;
  if (lVar4 < 0x20) {
    this->numvoices = this->numvoices + 1;
    pVVar3 = this->voicepool[lVar4];
  }
  else {
    pVVar3 = this->voicepool[0];
    fVar7 = pVVar3->aenv;
    lVar5 = 1;
    do {
      pVVar2 = this->voicepool[lVar5];
      fVar10 = pVVar2->fenv * pVVar2->aenv;
      fVar12 = pVVar3->fenv * fVar7;
      uVar6 = -(uint)(fVar10 < fVar12);
      if (fVar10 < fVar12) {
        pVVar3 = pVVar2;
      }
      fVar7 = (float)(~uVar6 & (uint)fVar7 | (uint)pVVar2->aenv & uVar6);
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
    iVar8 = (int)((ulong)pVVar3 >> 0x20);
    lVar4 = 0;
    do {
      ppVVar1 = this->keys + lVar4;
      auVar11._0_4_ = -(uint)(*(int *)ppVVar1 == (int)pVVar3);
      auVar11._4_4_ = -(uint)(*(int *)((long)ppVVar1 + 4) == iVar8);
      auVar11._8_4_ = -(uint)(*(int *)(ppVVar1 + 1) == (int)pVVar3);
      auVar11._12_4_ = -(uint)(*(int *)((long)ppVVar1 + 0xc) == iVar8);
      auVar9._4_4_ = auVar11._0_4_;
      auVar9._0_4_ = auVar11._4_4_;
      auVar9._8_4_ = auVar11._12_4_;
      auVar9._12_4_ = auVar11._8_4_;
      if ((auVar9 & auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->keys[lVar4] = (Voice *)0x0;
      }
      if ((auVar9 & auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->keys[lVar4 + 1] = (Voice *)0x0;
      }
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x80);
  }
  this->keys[key] = pVVar3;
  return pVVar3;
}

Assistant:

Voice* AllocateVoice(int key)
        {
            Voice* v = keys[key];
            if (v != NULL)
                return v;

            if (numvoices < MAXVOICES)
                v = voicepool[numvoices++];
            else
            {
                v = voicepool[0];
                for (int i = 1; i < numvoices; i++)
                {
                    Voice* q = voicepool[i];
                    if (q->GetImportance() < v->GetImportance())
                        v = q;
                }
                for (int n = 0; n < 128; n++)
                    if (keys[n] == v)
                        keys[n] = NULL;
            }

            keys[key] = v;
            return v;
        }